

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_complex.h
# Opt level: O2

Vertex_handle __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::add_vertex
          (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *this)

{
  Visitor *pVVar1;
  uint in_EAX;
  vertex_descriptor vVar2;
  Graph_vertex *pGVar3;
  Vertex_handle address;
  undefined8 uStack_18;
  
  uStack_18._0_4_ = in_EAX;
  vVar2 = boost::
          add_vertex<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,boost::no_property,boost::listS>,boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,boost::no_property,boost::listS>,boost::vecS,boost::setS,boost::undirectedS,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,boost::no_property,boost::listS>,boost::vecS,boost::setS,boost::undirectedS,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,boost::no_property,boost::listS>::config>>
                    (&(this->skeleton).super_type);
  this->num_vertices_ = this->num_vertices_ + 1;
  address.vertex = (boost_vertex_handle)vVar2;
  pGVar3 = operator[](this,address);
  pGVar3->is_active_ = true;
  pGVar3 = operator[](this,address);
  (pGVar3->id_).vertex = address.vertex;
  uStack_18 = (ulong)(uint)uStack_18;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (&this->degree_,(int *)((long)&uStack_18 + 4));
  pVVar1 = this->visitor;
  if (pVVar1 != (Visitor *)0x0) {
    (**(code **)(*(long *)pVVar1 + 0x10))(pVVar1,vVar2 & 0xffffffff);
  }
  return (Vertex_handle)address.vertex;
}

Assistant:

Vertex_handle add_vertex() {
    Vertex_handle address(boost::add_vertex(skeleton));
    num_vertices_++;
    (*this)[address].activate();
    // safe since we now that we are in the root complex and the field 'address' and 'id'
    // are identical for every vertices
    (*this)[address].set_id(Root_vertex_handle(address.vertex));
    degree_.push_back(0);
    if (visitor)
      visitor->on_add_vertex(address);
    return address;
  }